

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# completion_handler.hpp
# Opt level: O0

void asio::detail::
     completion_handler<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]tonk/TonkineseConnection.cpp:2184:27)>
     ::do_complete(void *owner,operation *base,error_code *param_3,size_t param_4)

{
  long in_RSI;
  long in_RDI;
  fenced_block b;
  type handler;
  handler_work<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseConnection_cpp:2184:27),_asio::system_executor>
  w;
  ptr p;
  completion_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseConnection_cpp:2184:27)>
  *h;
  undefined4 in_stack_ffffffffffffff98;
  half_t in_stack_ffffffffffffff9c;
  gcc_x86_fenced_block *in_stack_ffffffffffffffa0;
  type *local_50;
  handler_work<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseConnection_cpp:2184:27),_asio::system_executor>
  local_41;
  
  handler_work<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]tonk/TonkineseConnection.cpp:2184:27),_asio::system_executor>
  ::handler_work(&local_41,(type *)(in_RSI + 0x18));
  local_50 = *(type **)(in_RSI + 0x18);
  ptr::reset((ptr *)&local_50);
  if (in_RDI != 0) {
    gcc_x86_fenced_block::gcc_x86_fenced_block(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
    handler_work<tonk::Connection::tonk_flush()::$_0,asio::system_executor>::
    complete<tonk::Connection::tonk_flush()::__0>
              ((handler_work<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseConnection_cpp:2184:27),_asio::system_executor>
                *)in_stack_ffffffffffffffa0,
               (type *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
               (type *)0x1b9f63);
    gcc_x86_fenced_block::~gcc_x86_fenced_block(in_stack_ffffffffffffffa0);
  }
  handler_work<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]tonk/TonkineseConnection.cpp:2184:27),_asio::system_executor>
  ::~handler_work(&local_41);
  ptr::~ptr((ptr *)0x1b9faf);
  return;
}

Assistant:

static void do_complete(void* owner, operation* base,
      const asio::error_code& /*ec*/,
      std::size_t /*bytes_transferred*/)
  {
    // Take ownership of the handler object.
    completion_handler* h(static_cast<completion_handler*>(base));
    ptr p = { asio::detail::addressof(h->handler_), h, h };
    handler_work<Handler> w(h->handler_);

    ASIO_HANDLER_COMPLETION((*h));

    // Make a copy of the handler so that the memory can be deallocated before
    // the upcall is made. Even if we're not about to make an upcall, a
    // sub-object of the handler may be the true owner of the memory associated
    // with the handler. Consequently, a local copy of the handler is required
    // to ensure that any owning sub-object remains valid until after we have
    // deallocated the memory here.
    Handler handler(ASIO_MOVE_CAST(Handler)(h->handler_));
    p.h = asio::detail::addressof(handler);
    p.reset();

    // Make the upcall if required.
    if (owner)
    {
      fenced_block b(fenced_block::half);
      ASIO_HANDLER_INVOCATION_BEGIN(());
      w.complete(handler, handler);
      ASIO_HANDLER_INVOCATION_END;
    }
  }